

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_kd_tree_decoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudKdTreeDecoder::DecodeGeometryData(PointCloudKdTreeDecoder *this)

{
  bool bVar1;
  ValueType in_register_00000004;
  int32_t num_points;
  ValueType local_14;
  
  local_14 = in_register_00000004;
  bVar1 = DecoderBuffer::Decode<int>((this->super_PointCloudDecoder).buffer_,(int *)&local_14);
  if (-1 < (int)local_14 && bVar1) {
    ((this->super_PointCloudDecoder).point_cloud_)->num_points_ = local_14;
  }
  return -1 < (int)local_14 && bVar1;
}

Assistant:

bool PointCloudKdTreeDecoder::DecodeGeometryData() {
  int32_t num_points;
  if (!buffer()->Decode(&num_points)) {
    return false;
  }
  if (num_points < 0) {
    return false;
  }
  point_cloud()->set_num_points(num_points);
  return true;
}